

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::Draw::InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed>::createInstance
          (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *this,Context *context)

{
  DrawIndexed *this_00;
  TestSpecBase local_50;
  
  this_00 = (DrawIndexed *)operator_new(0x1e0);
  TestSpecBase::TestSpecBase(&local_50,&this->m_testSpec);
  anon_unknown_10::DrawIndexed::DrawIndexed(this_00,context,&local_50);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_50);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_testSpec);
	}